

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O1

void __thiscall
chrono::ChArchiveAsciiDump::out
          (ChArchiveAsciiDump *this,ChNameValue<chrono::ChEnumMapperBase> *bVal)

{
  ChStreamOutAscii *this_00;
  int iVar1;
  string mstr;
  long *local_40 [2];
  long local_30 [2];
  
  if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
    iVar1 = 0;
    do {
      chrono::ChStreamOutAscii::operator<<(this->ostream,"\t");
      iVar1 = iVar1 + 1;
    } while (iVar1 < *(int *)&(this->super_ChArchiveOut).field_0x104);
  }
  if (this->suppress_names == false) {
    this_00 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream,*(char **)bVal)
    ;
    chrono::ChStreamOutAscii::operator<<(this_00,"\t");
  }
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\"");
  (**(code **)(**(long **)(bVal + 8) + 0x10))((string *)local_40);
  chrono::ChStreamOutAscii::operator<<(this->ostream,(string *)local_40);
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\"\n");
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

virtual void out     (ChNameValue<ChEnumMapperBase> bVal) {
            indent();
            if (!suppress_names) 
                (*ostream) << bVal.name() << "\t";
            (*ostream) << "\"";
            std::string mstr = bVal.value().GetValueAsString();
            (*ostream) << mstr;
            (*ostream) << "\"\n";
      }